

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::PrintCallStack(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  byte local_199;
  Snapshot local_190;
  string local_178;
  string local_158;
  string local_138;
  undefined1 local_118 [8];
  cmListFileContext lfc;
  long local_c0;
  long commandLine;
  string commandName;
  undefined1 local_78 [8];
  cmOutputConverter converter;
  string local_50;
  undefined1 local_30 [8];
  Snapshot parent;
  ostream *out_local;
  cmListFileBacktrace *this_local;
  
  parent.Position.Position = (PositionType)out;
  bVar1 = cmState::Snapshot::IsValid(&this->Snapshot);
  if (bVar1) {
    cmState::Snapshot::GetCallStackParent((Snapshot *)local_30,&this->Snapshot);
    bVar1 = cmState::Snapshot::IsValid((Snapshot *)local_30);
    converter._31_1_ = 0;
    local_199 = 1;
    if (bVar1) {
      cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_50,(Snapshot *)local_30);
      converter._31_1_ = 1;
      local_199 = std::__cxx11::string::empty();
    }
    if ((converter._31_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if ((local_199 & 1) == 0) {
      commandName.field_2._8_8_ = (this->Snapshot).State;
      cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_78,this->Snapshot);
      cmState::Snapshot::GetEntryPointCommand_abi_cxx11_((string *)&commandLine,&this->Snapshot);
      local_c0 = cmState::Snapshot::GetEntryPointLine(&this->Snapshot);
      std::operator<<((ostream *)parent.Position.Position,"Call Stack (most recent call first):\n");
      while (bVar1 = cmState::Snapshot::IsValid((Snapshot *)local_30), bVar1) {
        cmListFileContext::cmListFileContext((cmListFileContext *)local_118);
        std::__cxx11::string::operator=((string *)local_118,(string *)&commandLine);
        lfc.FilePath.field_2._8_8_ = local_c0;
        cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_158,(Snapshot *)local_30);
        cmOutputConverter::Convert
                  (&local_138,(cmOutputConverter *)local_78,&local_158,HOME,UNCHANGED);
        std::__cxx11::string::operator=
                  ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        poVar2 = std::operator<<((ostream *)parent.Position.Position,"  ");
        poVar2 = ::operator<<(poVar2,(cmListFileContext *)local_118);
        std::operator<<(poVar2,"\n");
        cmState::Snapshot::GetEntryPointCommand_abi_cxx11_(&local_178,(Snapshot *)local_30);
        std::__cxx11::string::operator=((string *)&commandLine,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        local_c0 = cmState::Snapshot::GetEntryPointLine((Snapshot *)local_30);
        cmState::Snapshot::GetCallStackParent(&local_190,(Snapshot *)local_30);
        local_30 = (undefined1  [8])local_190.State;
        parent.State = (cmState *)local_190.Position.Tree;
        parent.Position.Tree =
             (cmLinkedTree<cmState::SnapshotDataType> *)local_190.Position.Position;
        cmListFileContext::~cmListFileContext((cmListFileContext *)local_118);
      }
      std::__cxx11::string::~string((string *)&commandLine);
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintCallStack(std::ostream& out) const
{
  if (!this->Snapshot.IsValid())
    {
    return;
    }
  cmState::Snapshot parent = this->Snapshot.GetCallStackParent();
  if (!parent.IsValid() || parent.GetExecutionListFile().empty())
    {
    return;
    }

  cmOutputConverter converter(this->Snapshot);
  std::string commandName = this->Snapshot.GetEntryPointCommand();
  long commandLine = this->Snapshot.GetEntryPointLine();

  out << "Call Stack (most recent call first):\n";
  while(parent.IsValid())
    {
    cmListFileContext lfc;
    lfc.Name = commandName;
    lfc.Line = commandLine;

    lfc.FilePath = converter.Convert(parent.GetExecutionListFile(),
                                     cmOutputConverter::HOME);
    out << "  " << lfc << "\n";

    commandName = parent.GetEntryPointCommand();
    commandLine = parent.GetEntryPointLine();
    parent = parent.GetCallStackParent();
    }
}